

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetMin.c
# Opt level: O2

Aig_Man_t * Saig_ManRetimeDupForward(Aig_Man_t *p,Vec_Ptr_t *vCut)

{
  int iVar1;
  Aig_Man_t *p_00;
  char *pcVar2;
  void *pvVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  int iVar6;
  
  p_00 = Aig_ManStart(p->vObjs->nSize);
  pcVar2 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar2;
  pcVar2 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar2;
  p_00->nRegs = vCut->nSize;
  iVar6 = p->nTruePos;
  p_00->nTruePis = p->nTruePis;
  p_00->nTruePos = iVar6;
  Aig_ManCleanData(p);
  p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  for (iVar6 = 0; iVar6 < p->nTruePis; iVar6 = iVar6 + 1) {
    pvVar3 = Vec_PtrEntry(p->vCis,iVar6);
    pAVar4 = Aig_ObjCreateCi(p_00);
    *(Aig_Obj_t **)((long)pvVar3 + 0x28) = pAVar4;
  }
  for (iVar6 = 0; iVar6 < vCut->nSize; iVar6 = iVar6 + 1) {
    pvVar3 = Vec_PtrEntry(vCut,iVar6);
    pAVar4 = Aig_ObjCreateCi(p_00);
    *(ulong *)((long)pvVar3 + 0x28) =
         (ulong)(*(uint *)((long)pvVar3 + 0x18) >> 3 & 1) ^ (ulong)pAVar4;
  }
  for (iVar6 = 0; iVar6 < p->vCos->nSize; iVar6 = iVar6 + 1) {
    pvVar3 = Vec_PtrEntry(p->vCos,iVar6);
    Saig_ManRetimeDup_rec(p_00,(Aig_Obj_t *)(*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe));
  }
  for (iVar6 = 0; iVar6 < p->nTruePos; iVar6 = iVar6 + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,iVar6);
    pAVar4 = Aig_ObjChild0Copy(pAVar4);
    Aig_ObjCreateCo(p_00,pAVar4);
  }
  for (iVar6 = 0; iVar1 = p->nRegs, iVar6 < iVar1; iVar6 = iVar6 + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,p->nTruePos + iVar6);
    pAVar5 = Aig_ObjChild0Copy(pAVar4);
    (pAVar4->field_5).pData = pAVar5;
  }
  for (iVar6 = 0; iVar6 < iVar1; iVar6 = iVar6 + 1) {
    pAVar4 = Saig_ManLi(p,iVar6);
    pAVar5 = Saig_ManLo(p,iVar6);
    pAVar5->field_5 = pAVar4->field_5;
    iVar1 = p->nRegs;
  }
  for (iVar6 = 0; iVar1 = vCut->nSize, iVar6 < iVar1; iVar6 = iVar6 + 1) {
    pvVar3 = Vec_PtrEntry(vCut,iVar6);
    if (0xfffffffd < (*(uint *)((long)pvVar3 + 0x18) & 7) - 7) {
      *(undefined8 *)((long)pvVar3 + 0x28) = 0;
    }
  }
  for (iVar6 = 0; iVar6 < iVar1; iVar6 = iVar6 + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(vCut,iVar6);
    Saig_ManRetimeDup_rec(p_00,pAVar4);
    Aig_ObjCreateCo(p_00,(Aig_Obj_t *)
                         ((ulong)(*(uint *)&pAVar4->field_0x18 >> 3 & 1) ^
                         (ulong)(pAVar4->field_5).pData));
    iVar1 = vCut->nSize;
  }
  Aig_ManCleanup(p_00);
  return p_00;
}

Assistant:

Aig_Man_t * Saig_ManRetimeDupForward( Aig_Man_t * p, Vec_Ptr_t * vCut )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int i;
    // mark the cones under the cut
//    assert( Vec_PtrSize(vCut) == Saig_ManRetimeCountCut(p, vCut) );
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nRegs = Vec_PtrSize(vCut);
    pNew->nTruePis = p->nTruePis;
    pNew->nTruePos = p->nTruePos;
    // create the true PIs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Saig_ManForEachPi( p, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    // create the registers
    Vec_PtrForEachEntry( Aig_Obj_t *, vCut, pObj, i )
        pObj->pData = Aig_NotCond( Aig_ObjCreateCi(pNew), pObj->fPhase );
    // duplicate logic above the cut
    Aig_ManForEachCo( p, pObj, i )
        Saig_ManRetimeDup_rec( pNew, Aig_ObjFanin0(pObj) );
    // create the true POs
    Saig_ManForEachPo( p, pObj, i )
        Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    // remember value in LI
    Saig_ManForEachLi( p, pObj, i )
        pObj->pData = Aig_ObjChild0Copy(pObj);
    // transfer values from the LIs to the LOs
    Saig_ManForEachLiLo( p, pObjLi, pObjLo, i )
        pObjLo->pData = pObjLi->pData;
    // erase the data values on the internal nodes of the cut
    Vec_PtrForEachEntry( Aig_Obj_t *, vCut, pObj, i )
        if ( Aig_ObjIsNode(pObj) )
            pObj->pData = NULL;
    // duplicate logic below the cut
    Vec_PtrForEachEntry( Aig_Obj_t *, vCut, pObj, i )
    {
        Saig_ManRetimeDup_rec( pNew, pObj );
        Aig_ObjCreateCo( pNew, Aig_NotCond((Aig_Obj_t *)pObj->pData, pObj->fPhase) );
    }
    Aig_ManCleanup( pNew );
    return pNew;
}